

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::appendWithSep
          (LocaleDisplayNamesImpl *this,UnicodeString *buffer,UnicodeString *src)

{
  UErrorCode status;
  UnicodeString *values [2];
  
  if ((ushort)(buffer->fUnion).fStackFields.fLengthAndFlags < 0x20) {
    UnicodeString::setTo(buffer,src);
  }
  else {
    status = U_ZERO_ERROR;
    values[0] = buffer;
    values[1] = src;
    SimpleFormatter::formatAndReplace
              (&this->separatorFormat,values,2,buffer,(int32_t *)0x0,0,&status);
  }
  return buffer;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::appendWithSep(UnicodeString& buffer, const UnicodeString& src) const {
    if (buffer.isEmpty()) {
        buffer.setTo(src);
    } else {
        const UnicodeString *values[2] = { &buffer, &src };
        UErrorCode status = U_ZERO_ERROR;
        separatorFormat.formatAndReplace(values, 2, buffer, NULL, 0, status);
    }
    return buffer;
}